

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O3

void __thiscall
amrex::DistributionMapping::RoundRobinDoIt
          (DistributionMapping *this,int nboxes,int param_2,
          vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *LIpairV,bool sort)

{
  ostringstream *poVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  size_type __new_size;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  Vector<int,_std::allocator<int>_> ord;
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  wrkerord;
  Vector<int,_std::allocator<int>_> w;
  allocator_type local_219;
  undefined1 local_218 [16];
  pointer local_208;
  undefined1 local_1f8 [16];
  pointer local_1e8;
  size_type local_1e0;
  DistributionMapping *local_1d8;
  vector<int,_std::allocator<int>_> local_1d0;
  Print local_1b8;
  
  local_1d8 = this;
  if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
    local_1b8.os = OutStream();
    local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
    poVar1 = &local_1b8.ss;
    local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"DM: RoundRobinDoIt called...",0x1c);
    std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    Print::~Print(&local_1b8);
  }
  iVar7 = *(int *)(DAT_0071a620 + -0x38);
  __new_size = (size_type)iVar7;
  local_208 = (pointer)0x0;
  local_218 = (undefined1  [16])0x0;
  local_1e8 = (pointer)0x0;
  local_1f8 = (undefined1  [16])0x0;
  if (sort) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_218,__new_size);
    auVar2 = _DAT_0065b9b0;
    if (0 < iVar7) {
      lVar8 = __new_size - 1;
      auVar9._8_4_ = (int)lVar8;
      auVar9._0_8_ = lVar8;
      auVar9._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar4 = 0;
      auVar9 = auVar9 ^ _DAT_0065b9b0;
      auVar11 = _DAT_0065b9a0;
      do {
        auVar12 = auVar11 ^ auVar2;
        if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                    auVar9._4_4_ < auVar12._4_4_) & 1)) {
          *(int *)(local_218._0_8_ + uVar4 * 4) = (int)uVar4;
        }
        if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
            auVar12._12_4_ <= auVar9._12_4_) {
          *(int *)(local_218._0_8_ + (uVar4 + 1) * 4) = (int)uVar4 + 1;
        }
        uVar4 = uVar4 + 2;
        lVar8 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 2;
        auVar11._8_8_ = lVar8 + 2;
      } while ((iVar7 + 1U & 0xfffffffe) != uVar4);
    }
  }
  else {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_218,__new_size);
    auVar9 = _DAT_0065f0d0;
    auVar11 = _DAT_0065b9b0;
    auVar2 = _DAT_0065b9a0;
    if (local_218._0_8_ != local_218._8_8_) {
      uVar4 = local_218._8_8_ + (-4 - local_218._0_8_);
      auVar12._8_4_ = (int)uVar4;
      auVar12._0_8_ = uVar4;
      auVar12._12_4_ = (int)(uVar4 >> 0x20);
      auVar10._0_8_ = uVar4 >> 2;
      auVar10._8_8_ = auVar12._8_8_ >> 2;
      uVar5 = 0;
      auVar10 = auVar10 ^ _DAT_0065b9b0;
      do {
        iVar3 = (int)uVar5;
        auVar13._8_4_ = iVar3;
        auVar13._0_8_ = uVar5;
        auVar13._12_4_ = (int)(uVar5 >> 0x20);
        auVar12 = (auVar13 | auVar2) ^ auVar11;
        iVar6 = auVar10._4_4_;
        if ((bool)(~(auVar12._4_4_ == iVar6 && auVar10._0_4_ < auVar12._0_4_ ||
                    iVar6 < auVar12._4_4_) & 1)) {
          *(int *)(local_218._0_8_ + uVar5 * 4) = iVar3;
        }
        if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
            auVar12._12_4_ <= auVar10._12_4_) {
          *(int *)(local_218._0_8_ + (uVar5 + 1) * 4) = iVar3 + 1;
        }
        auVar12 = (auVar13 | auVar9) ^ auVar11;
        iVar14 = auVar12._4_4_;
        if (iVar14 <= iVar6 && (iVar14 != iVar6 || auVar12._0_4_ <= auVar10._0_4_)) {
          *(int *)(local_218._0_8_ + (uVar5 + 2) * 4) = iVar3 + 2;
          *(int *)(local_218._0_8_ + (uVar5 + 3) * 4) = iVar3 + 3;
        }
        uVar5 = uVar5 + 4;
      } while (((uVar4 >> 2) + 4 & 0xfffffffffffffffc) != uVar5);
    }
  }
  std::
  vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
            *)local_1f8,__new_size);
  if (0 < iVar7) {
    lVar8 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&(((pointer)local_1f8._0_8_)->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar8),1);
      **(undefined4 **)
        ((long)&(((vector<int,_std::allocator<int>_> *)local_1f8._0_8_)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start + lVar8) = 0;
      lVar8 = lVar8 + 0x18;
    } while (__new_size * 0x18 != lVar8);
  }
  local_1b8.rank = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_1d0,__new_size,&local_1b8.rank,&local_219);
  local_1e0 = __new_size;
  if (LIpairV == (vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)0x0) {
    if (0 < nboxes) {
      poVar1 = &local_1b8.ss;
      uVar4 = 0;
      do {
        iVar7 = *(int *)(local_218._0_8_ +
                        ((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) %
                         (long)(int)local_1e0 & 0xffffffff) * 4);
        local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar7] =
             local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[iVar7] + 1;
        iVar7 = *(((pointer)(local_1f8._0_8_ + (long)iVar7 * 0x18))->
                 super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + iVar7;
        iVar6 = ParallelContext::Frame::local_to_global_rank((Frame *)(DAT_0071a620 + -0x48),iVar7);
        *(int *)(*(long *)&(((local_1d8->m_ref).
                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar4 * 4) =
             iVar6;
        if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
          local_1b8.os = OutStream();
          local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
          local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
               *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"  Mapping box ",0xe)
          ;
          std::ostream::operator<<(poVar1,(int)uVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," to rank ",9);
          std::ostream::operator<<(poVar1,iVar7);
          std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          Print::~Print(&local_1b8);
        }
        uVar4 = uVar4 + 1;
      } while ((uint)nboxes != uVar4);
    }
  }
  else if (0 < nboxes) {
    poVar1 = &local_1b8.ss;
    lVar8 = 0;
    iVar7 = 0;
    do {
      iVar6 = *(int *)(local_218._0_8_ + ((long)iVar7 % (long)(int)local_1e0 & 0xffffffff) * 4);
      local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar6] =
           local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar6] + 1;
      iVar6 = *(((pointer)(local_1f8._0_8_ + (long)iVar6 * 0x18))->
               super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + iVar6;
      iVar3 = ParallelContext::Frame::local_to_global_rank((Frame *)(DAT_0071a620 + -0x48),iVar6);
      *(int *)(*(long *)&(((local_1d8->m_ref).
                           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl +
              (long)*(int *)((long)&((LIpairV->
                                     super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->second + lVar8) *
              4) = iVar3;
      if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
        local_1b8.os = OutStream();
        local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
        local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"  Mapping box ",0xe);
        std::ostream::operator<<
                  (poVar1,*(int *)((long)&((LIpairV->
                                           super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->second +
                                  lVar8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," of size ",9);
        std::ostream::_M_insert<long>((long)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," to rank ",9);
        std::ostream::operator<<(poVar1,iVar6);
        std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        Print::~Print(&local_1b8);
      }
      iVar7 = iVar7 + 1;
      lVar8 = lVar8 + 0x10;
    } while ((ulong)(uint)nboxes << 4 != lVar8);
  }
  if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
             *)local_1f8);
  if ((pointer)local_218._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_218._0_8_,(long)local_208 - local_218._0_8_);
  }
  return;
}

Assistant:

void
DistributionMapping::RoundRobinDoIt (int                  nboxes,
                                     int                 /* nprocs */,
                                     std::vector<LIpair>* LIpairV,
                                     bool                 sort)
{
    if (flag_verbose_mapper) {
        Print() << "DM: RoundRobinDoIt called..." << std::endl;
    }

    int nprocs = ParallelContext::NProcsSub();

    // If team is not use, we are going to treat it as a special case in which
    // the number of teams is nprocs and the number of workers is 1.

    int nteams = nprocs;
    int nworkers = 1;
#if defined(BL_USE_TEAM)
    nteams = ParallelDescriptor::NTeams();
    nworkers = ParallelDescriptor::TeamSize();
#endif

    Vector<int> ord;
    Vector<Vector<int> > wrkerord;

    if (nteams == nprocs)  {
        if (sort) {
            LeastUsedCPUs(nprocs,ord);
        } else {
            ord.resize(nprocs);
            std::iota(ord.begin(), ord.end(), 0);
        }
        wrkerord.resize(nprocs);
        for (int i = 0; i < nprocs; ++i) {
            wrkerord[i].resize(1);
            wrkerord[i][0] = 0;
        }
    } else {
        if (sort) {
            LeastUsedTeams(ord,wrkerord,nteams,nworkers);
        } else {
            ord.resize(nteams);
            std::iota(ord.begin(), ord.end(), 0);
            wrkerord.resize(nteams);
            for (auto& v : wrkerord) {
                v.resize(nworkers);
                std::iota(v.begin(), v.end(), 0);
            }
        }
    }

    Vector<int> w(nteams,0);

    if (LIpairV)
    {
        BL_ASSERT(static_cast<int>(LIpairV->size()) == nboxes);

        for (int i = 0; i < nboxes; ++i)
        {
            int tid = ord[i%nteams];
            int wid = (w[tid]++) % nworkers;
            int rank = tid*nworkers + wrkerord[tid][wid];
            m_ref->m_pmap[(*LIpairV)[i].second] = ParallelContext::local_to_global_rank(rank);
            if (flag_verbose_mapper) {
                Print() << "  Mapping box " << (*LIpairV)[i].second << " of size "
                        << (*LIpairV)[i].first << " to rank " << rank << std::endl;
            }
        }
    }
    else
    {
        for (int i = 0; i < nboxes; ++i)
        {
            int tid = ord[i%nteams];
            int wid = (w[tid]++) % nworkers;
            int rank = tid*nworkers + wrkerord[tid][wid];
            m_ref->m_pmap[i] = ParallelContext::local_to_global_rank(rank);
            if (flag_verbose_mapper) {
                Print() << "  Mapping box " << i << " to rank " << rank << std::endl;
            }
        }
    }
}